

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 **ppuVar1;
  uint32 *puVar2;
  sparse_bit_array *in_RSI;
  sparse_bit_array *in_RDI;
  uint i;
  uint in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  sparse_bit_array *count;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->m_num_groups != in_RSI->m_num_groups) {
      count = in_RDI;
      clear((sparse_bit_array *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_RDI->m_num_groups = in_RSI->m_num_groups;
      ppuVar1 = (uint32 **)
                crnlib_calloc((size_t)count,(size_t)in_RSI,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_RDI->m_ppGroups = ppuVar1;
      if (in_RDI->m_ppGroups == (uint32 **)0x0) {
        crnlib_assert(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
      }
    }
    for (uVar3 = 0; uVar3 < in_RDI->m_num_groups; uVar3 = uVar3 + 1) {
      if (in_RSI->m_ppGroups[uVar3] == (uint32 *)0x0) {
        if (in_RDI->m_ppGroups[uVar3] != (uint32 *)0x0) {
          free_group((void *)0x1970ab);
          in_RDI->m_ppGroups[uVar3] = (uint32 *)0x0;
        }
      }
      else {
        if (in_RDI->m_ppGroups[uVar3] == (uint32 *)0x0) {
          puVar2 = alloc_group(SUB41(uVar3 >> 0x18,0));
          in_RDI->m_ppGroups[uVar3] = puVar2;
        }
        memcpy(in_RDI->m_ppGroups[uVar3],in_RSI->m_ppGroups[uVar3],0x40);
      }
    }
  }
  return in_RDI;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator=(sparse_bit_array& other) {
  if (this == &other)
    return *this;

  if (m_num_groups != other.m_num_groups) {
    clear();

    m_num_groups = other.m_num_groups;
    m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
    CRNLIB_VERIFY(m_ppGroups);
  }

  for (uint i = 0; i < m_num_groups; i++) {
    if (other.m_ppGroups[i]) {
      if (!m_ppGroups[i])
        m_ppGroups[i] = alloc_group(false);
      memcpy(m_ppGroups[i], other.m_ppGroups[i], cBytesPerGroup);
    } else if (m_ppGroups[i]) {
      free_group(m_ppGroups[i]);
      m_ppGroups[i] = NULL;
    }
  }

  return *this;
}